

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O1

void glob_finderror(t_pd *dummy)

{
  if (error_object != (void *)0x0) {
    post("last trackable error:");
    post("%s",error_string);
    canvas_finderror(error_object);
    return;
  }
  post("no findable error yet");
  return;
}

Assistant:

void glob_finderror(t_pd *dummy)
{
    if (!error_object)
        post("no findable error yet");
    else
    {
        post("last trackable error:");
        post("%s", error_string);
        canvas_finderror(error_object);
    }
}